

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

int item_number(Fl_Menu_Item *m,char *i)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *local_20;
  char *i_local;
  Fl_Menu_Item *m_local;
  
  local_20 = i;
  if ((m != (Fl_Menu_Item *)0x0) && (i != (char *)0x0)) {
    i_local = (char *)m;
    if ((*i == 'F') && ((i[1] == 'L' && (i[2] == '_')))) {
      local_20 = i + 3;
    }
    while (pcVar2 = Fl_Menu_Item::label((Fl_Menu_Item *)i_local), pcVar2 != (char *)0x0) {
      pcVar2 = Fl_Menu_Item::label((Fl_Menu_Item *)i_local);
      iVar1 = strcmp(pcVar2,local_20);
      if (iVar1 == 0) {
        lVar3 = Fl_Menu_Item::argument((Fl_Menu_Item *)i_local);
        return (int)lVar3;
      }
      i_local = i_local + 0x38;
    }
  }
  iVar1 = atoi(local_20);
  return iVar1;
}

Assistant:

int item_number(Fl_Menu_Item* m, const char* i) {
  if (m && i) {
    if (i[0]=='F' && i[1]=='L' && i[2]=='_') i += 3;
    while (m->label()) {
      if (!strcmp(m->label(), i)) return int(m->argument());
      m++;
    }
  }
  return atoi(i);
}